

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setNamedItemNS(DOMNamedNodeMapImpl *this,DOMNode *arg)

{
  short sVar1;
  short sVar2;
  XMLSize_t XVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar7;
  long lVar8;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar9;
  short *psVar10;
  short *psVar11;
  DOMNode *pDVar12;
  short *psVar13;
  short *psVar14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  DOMException *this_01;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  short *psVar15;
  ulong uVar16;
  DOMNode *pDVar17;
  ulong index;
  MemoryManager **ppMVar18;
  bool bVar19;
  DOMNode *local_48;
  DOMDocument *pDVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
  pDVar6 = (DOMDocument *)CONCAT44(extraout_var,iVar5);
  if (arg == (DOMNode *)0x0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if ((plVar7 == (long *)0x0) || (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 == 0)) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
  }
  else {
    this_00 = (DOMNodeImpl *)(**(code **)(*plVar7 + 0x10))(plVar7);
    pDVar9 = DOMNodeImpl::getOwnerDocument(this_00);
    if (pDVar9 == pDVar6) {
      bVar4 = readOnly(this);
      if (bVar4) {
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar18 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_10,iVar5) != 0)
           ) {
          iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar18 = (MemoryManager **)(CONCAT44(extraout_var_11,iVar5) + 0x158);
        }
        DOMException::DOMException(this_01,7,0,*ppMVar18);
      }
      else {
        if ((*(uint *)&this_00->flags & 8) == 0) {
          this_00->fOwnerNode = this->fOwnerNode;
          this_00->flags = (ushort)*(uint *)&this_00->flags | 8;
          iVar5 = (*arg->_vptr_DOMNode[0x16])(arg);
          psVar10 = (short *)CONCAT44(extraout_var_00,iVar5);
          iVar5 = (*arg->_vptr_DOMNode[0x18])(arg);
          psVar11 = (short *)CONCAT44(extraout_var_01,iVar5);
          pDVar12 = &pDVar6->super_DOMNode;
          if (pDVar6 == (DOMDocument *)0x0) {
            pDVar12 = (DOMNode *)0x0;
          }
          bVar4 = false;
          uVar16 = 0;
          do {
            if (this->fBuckets[uVar16] != (DOMNodeVector *)0x0) {
              XVar3 = this->fBuckets[uVar16]->nextFreeSlot;
              if (XVar3 == 0) {
                bVar19 = true;
              }
              else {
                index = 0;
                do {
                  if (index < this->fBuckets[uVar16]->nextFreeSlot) {
                    pDVar17 = this->fBuckets[uVar16]->data[index];
                  }
                  else {
                    pDVar17 = (DOMNode *)0x0;
                  }
                  iVar5 = (*pDVar17->_vptr_DOMNode[0x16])(pDVar17);
                  psVar13 = (short *)CONCAT44(extraout_var_02,iVar5);
                  iVar5 = (*pDVar17->_vptr_DOMNode[0x18])(pDVar17);
                  psVar14 = (short *)CONCAT44(extraout_var_03,iVar5);
                  if (psVar13 == psVar10) {
LAB_00278d19:
                    if (psVar11 != psVar14) {
                      psVar13 = psVar14;
                      if ((psVar11 == (short *)0x0) || (psVar15 = psVar11, psVar14 == (short *)0x0))
                      {
                        if (psVar11 == (short *)0x0) {
                          if (psVar14 == (short *)0x0) goto LAB_00278d81;
LAB_00278d72:
                          bVar19 = *psVar13 == 0;
                        }
                        else {
                          bVar19 = *psVar11 == 0;
                          if ((psVar14 != (short *)0x0) && (*psVar11 == 0)) goto LAB_00278d72;
                        }
                        if (bVar19) goto LAB_00278d81;
                      }
                      else {
                        do {
                          sVar1 = *psVar15;
                          if (sVar1 == 0) goto LAB_00278d72;
                          sVar2 = *psVar13;
                          psVar13 = psVar13 + 1;
                          psVar15 = psVar15 + 1;
                        } while (sVar1 == sVar2);
                      }
                      iVar5 = 0;
                      if (psVar14 != (short *)0x0) goto LAB_00278e45;
                      iVar5 = (*pDVar17->_vptr_DOMNode[2])(pDVar17);
                      psVar13 = (short *)CONCAT44(extraout_var_04,iVar5);
                      if (psVar11 == psVar13) goto LAB_00278d81;
                      iVar5 = 0;
                      if ((psVar11 != (short *)0x0) && (psVar14 = psVar11, psVar13 != (short *)0x0))
                      {
                        do {
                          sVar1 = *psVar14;
                          if (sVar1 == 0) goto LAB_00278ec1;
                          sVar2 = *psVar13;
                          psVar13 = psVar13 + 1;
                          psVar14 = psVar14 + 1;
                        } while (sVar1 == sVar2);
                        goto LAB_00278e45;
                      }
                      if (psVar11 == (short *)0x0) {
                        if (psVar13 == (short *)0x0) goto LAB_00278d81;
LAB_00278ec1:
                        bVar19 = *psVar13 == 0;
                      }
                      else {
                        bVar19 = *psVar11 == 0;
                        if ((psVar13 != (short *)0x0) && (*psVar11 == 0)) goto LAB_00278ec1;
                      }
                      if (!bVar19) goto LAB_00278e45;
                    }
LAB_00278d81:
                    DOMNodeVector::setElementAt(this->fBuckets[uVar16],arg,index);
                    plVar7 = (long *)__dynamic_cast(pDVar17,&DOMNode::typeinfo,
                                                    &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar7 == (long *)0x0) ||
                       (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 == 0)) {
                      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                      DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                      goto LAB_00278f8d;
                    }
                    lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
                    *(DOMNode **)(lVar8 + 8) = pDVar12;
                    plVar7 = (long *)__dynamic_cast(pDVar17,&DOMNode::typeinfo,
                                                    &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar7 == (long *)0x0) ||
                       (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 == 0)) {
                      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                      DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                      goto LAB_00278f8d;
                    }
                    lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
                    *(ushort *)(lVar8 + 0x10) = *(ushort *)(lVar8 + 0x10) & 0xfff7;
                    iVar5 = 1;
                    local_48 = pDVar17;
                  }
                  else {
                    psVar15 = psVar10;
                    if ((psVar10 == (short *)0x0) || (psVar13 == (short *)0x0)) {
                      if (psVar13 == (short *)0x0) {
                        if (psVar10 == (short *)0x0) goto LAB_00278d19;
LAB_00278d05:
                        bVar19 = *psVar15 == 0;
                      }
                      else {
                        bVar19 = *psVar13 == 0;
                        if ((psVar10 != (short *)0x0) && (*psVar13 == 0)) goto LAB_00278d05;
                      }
                      iVar5 = 7;
                      if (bVar19) goto LAB_00278d19;
                    }
                    else {
                      do {
                        sVar1 = *psVar13;
                        if (sVar1 == 0) goto LAB_00278d05;
                        psVar13 = psVar13 + 1;
                        sVar2 = *psVar15;
                        psVar15 = psVar15 + 1;
                      } while (sVar1 == sVar2);
                      iVar5 = 7;
                    }
                  }
LAB_00278e45:
                  if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_00278ed7;
                  index = index + 1;
                } while (index != XVar3);
                iVar5 = 0;
LAB_00278ed7:
                bVar19 = iVar5 == 0;
              }
              if (!bVar19) break;
            }
            bVar4 = 0xbf < uVar16;
            uVar16 = uVar16 + 1;
          } while (uVar16 != 0xc1);
          if (!bVar4) {
            return local_48;
          }
          iVar5 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[2])(this,arg);
          return (DOMNode *)CONCAT44(extraout_var_05,iVar5);
        }
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar18 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_08,iVar5) != 0)
           ) {
          iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar18 = (MemoryManager **)(CONCAT44(extraout_var_09,iVar5) + 0x158);
        }
        DOMException::DOMException(this_01,10,0,*ppMVar18);
      }
    }
    else {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      ppMVar18 = &XMLPlatformUtils::fgMemoryManager;
      if ((this->fOwnerNode != (DOMNode *)0x0) &&
         (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_06,iVar5) != 0))
      {
        iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        ppMVar18 = (MemoryManager **)(CONCAT44(extraout_var_07,iVar5) + 0x158);
      }
      DOMException::DOMException(this_01,4,0,*ppMVar18);
    }
  }
LAB_00278f8d:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode * DOMNamedNodeMapImpl::setNamedItemNS(DOMNode *arg)
{
    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if (argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR,0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (argImpl->isOwned())
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);

    const XMLCh* namespaceURI=arg->getNamespaceURI();
    const XMLCh* localName=arg->getLocalName();
    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->setElementAt(arg,i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    // if not found, add it using the full name as key
    return setNamedItem(arg);
}